

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_double_sprintf<double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          double value,format_specs *spec,basic_buffer<char> *buffer)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  type tVar4;
  size_t sVar5;
  char *format_00;
  char *pcVar6;
  basic_buffer<char> *in_RDX;
  basic_format_specs<char> *in_RSI;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *in_RDI;
  double in_XMM0_Qa;
  uint n;
  int result;
  size_t buffer_size;
  char_type *start;
  char_type *format_ptr;
  char_type format [10];
  size_t in_stack_ffffffffffffff78;
  basic_buffer<char> *in_stack_ffffffffffffff80;
  ulong in_stack_ffffffffffffff88;
  char *local_38;
  char local_2a;
  char local_29 [9];
  basic_buffer<char> *local_20;
  basic_format_specs<char> *local_18;
  double local_10;
  
  local_38 = local_29;
  local_2a = '%';
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_XMM0_Qa;
  bVar1 = basic_format_specs<char>::flag(in_RSI,8);
  if (bVar1) {
    pcVar6 = local_38 + 1;
    *local_38 = '#';
    local_38 = pcVar6;
  }
  iVar3 = basic_format_specs<char>::precision(local_18);
  if (-1 < iVar3) {
    pcVar6 = local_38 + 1;
    *local_38 = '.';
    local_38 = local_38 + 2;
    *pcVar6 = '*';
  }
  append_float_length<double>(in_RDI,&local_38,local_10);
  cVar2 = basic_format_specs<char>::type(local_18);
  *local_38 = cVar2;
  local_38[1] = '\0';
  local_38 = local_38 + 1;
  while( true ) {
    while( true ) {
      sVar5 = internal::basic_buffer<char>::capacity(local_20);
      format_00 = internal::basic_buffer<char>::operator[](local_20,0);
      pcVar6 = &local_2a;
      basic_format_specs<char>::precision(local_18);
      iVar3 = internal::char_traits<char>::format_float<double>
                        (pcVar6,sVar5,format_00,(int)(in_stack_ffffffffffffff88 >> 0x20),
                         (double)in_stack_ffffffffffffff80);
      if (-1 < iVar3) break;
      in_stack_ffffffffffffff80 = local_20;
      internal::basic_buffer<char>::capacity(local_20);
      internal::basic_buffer<char>::reserve(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    tVar4 = internal::to_unsigned<int>(iVar3);
    in_stack_ffffffffffffff88 = (ulong)tVar4;
    sVar5 = internal::basic_buffer<char>::capacity(local_20);
    if (in_stack_ffffffffffffff88 < sVar5) break;
    internal::basic_buffer<char>::reserve(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  internal::basic_buffer<char>::resize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  return;
}

Assistant:

void basic_writer<Range>::write_double_sprintf(
    T value, const format_specs &spec,
    internal::basic_buffer<char_type>& buffer) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buffer.capacity() != 0, "empty buffer");

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  char_type format[MAX_FORMAT_SIZE];
  char_type *format_ptr = format;
  *format_ptr++ = '%';
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = spec.type();
  *format_ptr = '\0';

  // Format using snprintf.
  char_type *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buffer.capacity();
    start = &buffer[0];
    int result = internal::char_traits<char_type>::format_float(
        start, buffer_size, format, spec.precision(), value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buffer.capacity()) {
        buffer.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buffer.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer.reserve(buffer.capacity() + 1);
    }
  }
}